

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O1

int __thiscall cinatra::coro_http_server::listen(coro_http_server *this,int __fd,int __n)

{
  implementation_type *impl;
  acceptor *this_00;
  undefined8 *puVar1;
  undefined8 *puVar2;
  ushort uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 this_01;
  int iVar6;
  cerr_logger_t *this_02;
  uint uVar7;
  error_code eVar8;
  error_code ec;
  error_code ignore_ec;
  endpoint_type end_point;
  endpoint_type endpoint;
  resolver resolver;
  query query;
  error_code local_190;
  cerr_logger_t local_179;
  undefined1 local_178 [16];
  size_t local_168;
  object_fns *local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  endpoint_type local_134;
  sockaddr local_118;
  undefined4 uStack_108;
  undefined8 uStack_104;
  undefined1 local_f0 [80];
  basic_resolver_query<asio::ip::tcp> local_a0;
  
  local_190._M_value = 0;
  local_190._M_cat = (error_category *)std::_V2::system_category();
  uVar3 = this->port_;
  uVar7 = 1;
  if (((9 < uVar3) && (uVar7 = 2, 99 < uVar3)) && (uVar7 = 3, 999 < uVar3)) {
    uVar7 = 5 - (uVar3 < 10000);
  }
  local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._M_cat;
  local_f0._0_8_ = (resolver_service<asio::ip::tcp> *)(local_f0 + 0x10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             (ulong)uVar7,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f0._0_8_,uVar7,(uint)uVar3);
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            (&local_a0,&this->address_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
             address_configured);
  if ((resolver_service<asio::ip::tcp> *)local_f0._0_8_ !=
      (resolver_service<asio::ip::tcp> *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  asio::execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor((any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  *)local_178,
                 &(this->acceptor_).impl_.executor_.
                  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                );
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl((io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
                    *)local_f0,0,(executor_type *)local_178);
  (*local_160->destroy)((any_executor_base *)local_178);
  asio::detail::resolver_service<asio::ip::tcp>::resolve
            ((results_type *)local_178,(resolver_service<asio::ip::tcp> *)local_f0._0_8_,
             (implementation_type *)(local_f0 + 8),&local_a0,&local_190);
  this_01 = local_178._8_8_;
  if ((long *)CONCAT44(local_178._4_4_,local_178._0_4_) == (long *)0x0 || local_190._M_value != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bad address: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(this->address_)._M_dataplus._M_p,
               (this->address_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error: ",8);
    (*(*(_func_int ***)&(local_190._M_cat)->field_0x0)[4])
              (local_178,local_190._M_cat,(ulong)(uint)local_190._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT44(local_178._4_4_,local_178._0_4_),
               local_178._8_8_);
    if ((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_) != &local_168) {
      operator_delete((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_),local_168 + 1);
    }
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&local_118);
    uVar7 = local_190._M_value;
    if (local_190._M_value == 0) {
      std::_V2::generic_category();
      uVar7 = 99;
    }
    goto LAB_001c0249;
  }
  lVar4 = *(long *)CONCAT44(local_178._4_4_,local_178._0_4_);
  puVar1 = (undefined8 *)(lVar4 + local_168 * 0x60);
  local_118._0_8_ = *puVar1;
  puVar2 = (undefined8 *)(lVar4 + 0xc + local_168 * 0x60);
  uVar5 = *puVar2;
  uStack_104 = puVar2[1];
  local_118.sa_data._6_4_ = SUB84(puVar1[1],0);
  local_118.sa_data._10_4_ = SUB84(uVar5,0);
  uStack_108 = (undefined4)((ulong)uVar5 >> 0x20);
  iVar6 = (uint)(local_118.sa_family != 2) * 8 + 2;
  impl = &(this->acceptor_).impl_.implementation_;
  eVar8 = asio::detail::reactive_socket_service_base::do_open
                    (&((this->acceptor_).impl_.service_)->super_reactive_socket_service_base,
                     &impl->super_base_implementation_type,iVar6,1,6,&local_190);
  if (eVar8._M_value == 0) {
    (this->acceptor_).impl_.implementation_.protocol_.family_ = iVar6;
  }
  if (local_190._M_value == 0) {
    this_00 = &this->acceptor_;
    local_178._0_4_ = 1;
    asio::detail::reactive_socket_service<asio::ip::tcp>::
    set_option<asio::detail::socket_option::boolean<1,2>>
              ((this_00->impl_).service_,impl,(boolean<1,_2> *)local_178,&local_190);
    iVar6 = (int)impl;
    asio::detail::reactive_socket_service<asio::ip::tcp>::bind
              ((this_00->impl_).service_,iVar6,&local_118,(socklen_t)&local_190);
    if (local_190._M_value != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bind port: ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error: ",8);
      (*(*(_func_int ***)&(local_190._M_cat)->field_0x0)[4])
                (local_178,local_190._M_cat,(ulong)(uint)local_190._M_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)CONCAT44(local_178._4_4_,local_178._0_4_),
                 local_178._8_8_);
      if ((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_) != &local_168) {
        operator_delete((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_),local_168 + 1);
      }
      cerr_logger_t::~cerr_logger_t((cerr_logger_t *)&local_134);
      local_178._0_4_ = 0;
      local_178._8_8_ = local_140;
      asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel
                (this_00,(error_code *)local_178);
      asio::detail::reactive_socket_service_base::close
                (&((this_00->impl_).service_)->super_reactive_socket_service_base,iVar6);
      uVar7 = local_190._M_value;
      goto LAB_001c0249;
    }
    asio::detail::reactive_socket_service_base::listen
              (&((this_00->impl_).service_)->super_reactive_socket_service_base,iVar6,0x1000);
    if (local_190._M_value != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"get local endpoint port: ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," listen error: ",0xf);
      (*(*(_func_int ***)&(local_190._M_cat)->field_0x0)[4])
                (local_178,local_190._M_cat,(ulong)(uint)local_190._M_value);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)CONCAT44(local_178._4_4_,local_178._0_4_),
                 local_178._8_8_);
      goto LAB_001c0111;
    }
    asio::detail::reactive_socket_service<asio::ip::tcp>::local_endpoint
              (&local_134,(this_00->impl_).service_,impl,&local_190);
    if (local_190._M_value == 0) {
      this->port_ = local_134.impl_.data_.v4.sin_port << 8 | local_134.impl_.data_.v4.sin_port >> 8;
      uVar7 = 0;
      goto LAB_001c0249;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"get local endpoint port: ",0x19);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error: ",8);
    (*(*(_func_int ***)&(local_190._M_cat)->field_0x0)[4])
              (local_178,local_190._M_cat,(ulong)(uint)local_190._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT44(local_178._4_4_,local_178._0_4_),
               local_178._8_8_);
    if ((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_) != &local_168) {
      operator_delete((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_),local_168 + 1);
    }
    this_02 = &local_179;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"acceptor open failed",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error: ",8);
    (*(*(_func_int ***)&(local_190._M_cat)->field_0x0)[4])
              (local_178,local_190._M_cat,(ulong)(uint)local_190._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(char *)CONCAT44(local_178._4_4_,local_178._0_4_),
               local_178._8_8_);
LAB_001c0111:
    if ((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_) != &local_168) {
      operator_delete((size_t *)CONCAT44(local_178._4_4_,local_178._0_4_),local_168 + 1);
    }
    this_02 = (cerr_logger_t *)&local_134;
  }
  cerr_logger_t::~cerr_logger_t(this_02);
  uVar7 = local_190._M_value;
LAB_001c0249:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl((io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
                     *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.service_name_._M_dataplus._M_p != &local_a0.service_name_.field_2) {
    operator_delete(local_a0.service_name_._M_dataplus._M_p,
                    local_a0.service_name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.host_name_._M_dataplus._M_p != &local_a0.host_name_.field_2) {
    operator_delete(local_a0.host_name_._M_dataplus._M_p,
                    local_a0.host_name_.field_2._M_allocated_capacity + 1);
  }
  return uVar7;
}

Assistant:

std::error_code listen() {
    CINATRA_LOG_INFO << "begin to listen " << port_;
    using asio::ip::tcp;
    asio::error_code ec;

    asio::ip::tcp::resolver::query query(address_, std::to_string(port_));
    asio::ip::tcp::resolver resolver(acceptor_.get_executor());
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query, ec);

    asio::ip::tcp::resolver::iterator it_end;
    if (ec || it == it_end) {
      CINATRA_LOG_ERROR << "bad address: " << address_
                        << " error: " << ec.message();
      if (ec) {
        return ec;
      }
      return std::make_error_code(std::errc::address_not_available);
    }

    auto endpoint = it->endpoint();
    acceptor_.open(endpoint.protocol(), ec);
    if (ec) {
      CINATRA_LOG_ERROR << "acceptor open failed"
                        << " error: " << ec.message();
      return ec;
    }
#ifdef __GNUC__
    acceptor_.set_option(tcp::acceptor::reuse_address(true), ec);
#endif
    acceptor_.bind(endpoint, ec);
    if (ec) {
      CINATRA_LOG_ERROR << "bind port: " << port_ << " error: " << ec.message();
      std::error_code ignore_ec;
      acceptor_.cancel(ignore_ec);
      acceptor_.close(ignore_ec);
      return ec;
    }
#ifdef _MSC_VER
    acceptor_.set_option(tcp::acceptor::reuse_address(true));
#endif
    acceptor_.listen(asio::socket_base::max_listen_connections, ec);
    if (ec) {
      CINATRA_LOG_ERROR << "get local endpoint port: " << port_
                        << " listen error: " << ec.message();
      return ec;
    }

    auto end_point = acceptor_.local_endpoint(ec);
    if (ec) {
      CINATRA_LOG_ERROR << "get local endpoint port: " << port_
                        << " error: " << ec.message();
      return ec;
    }
    port_ = end_point.port();

    CINATRA_LOG_INFO << "listen port " << port_ << " successfully";
    return {};
  }